

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsPreventExtension(JsValueRef object)

{
  JsErrorCode JVar1;
  JsValueRef local_10;
  JsValueRef object_local;
  
  local_10 = object;
  JVar1 = ContextAPIWrapper<false,JsPreventExtension::__0>((anon_class_8_1_6424947d)&local_10);
  return JVar1;
}

Assistant:

CHAKRA_API JsPreventExtension(_In_ JsValueRef object)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);

        Js::VarTo<Js::RecyclableObject>(object)->PreventExtensions();

        return JsNoError;
    });
}